

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O0

bool __thiscall
wallet::DescriptorScriptPubKeyMan::CanUpdateToWalletDescriptor
          (DescriptorScriptPubKeyMan *this,WalletDescriptor *descriptor,string *error)

{
  long lVar1;
  bool bVar2;
  DescriptorScriptPubKeyMan *in_RDX;
  AnnotatedMixin<std::recursive_mutex> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock81;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  undefined4 in_stack_ffffffffffffff98;
  undefined1 fTry;
  int in_stack_ffffffffffffff9c;
  WalletDescriptor *in_stack_ffffffffffffffa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  bool local_3d;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd8;
  
  fTry = (undefined1)((uint)in_stack_ffffffffffffff98 >> 0x18);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffff78);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)this_00,in_RSI,(char *)in_RDX,
             (char *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,(bool)fTry);
  bVar2 = HasWalletDescriptor(in_RDX,in_stack_ffffffffffffffa0);
  if (bVar2) {
    if ((*(int *)((long)&in_RDI[0xc].field_2 + 8) <
         in_RSI[1].super_recursive_mutex.super___recursive_mutex_base._M_mutex.__data.__kind) ||
       (*(int *)((long)&in_RSI[1].super_recursive_mutex.super___recursive_mutex_base._M_mutex + 0x14
                ) < *(int *)((long)&in_RDI[0xc].field_2 + 0xc))) {
      tinyformat::format<int,int>((char *)this_00,(int *)in_RSI,(int *)in_RDX);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
      std::__cxx11::string::~string(in_stack_ffffffffffffff78);
      local_3d = false;
    }
    else {
      local_3d = true;
    }
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_RDI,(char *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
    local_3d = false;
  }
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffff78);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_3d;
  }
  __stack_chk_fail();
}

Assistant:

bool DescriptorScriptPubKeyMan::CanUpdateToWalletDescriptor(const WalletDescriptor& descriptor, std::string& error)
{
    LOCK(cs_desc_man);
    if (!HasWalletDescriptor(descriptor)) {
        error = "can only update matching descriptor";
        return false;
    }

    if (descriptor.range_start > m_wallet_descriptor.range_start ||
        descriptor.range_end < m_wallet_descriptor.range_end) {
        // Use inclusive range for error
        error = strprintf("new range must include current range = [%d,%d]",
                          m_wallet_descriptor.range_start,
                          m_wallet_descriptor.range_end - 1);
        return false;
    }

    return true;
}